

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

bool __thiscall doublechecked::Roaring::operator==(Roaring *this,Roaring *r)

{
  bool bVar1;
  uint uVar2;
  unsigned_long in_RSI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  bool ans;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar3;
  
  bVar1 = roaring::Roaring::operator==
                    ((Roaring *)in_RDI,
                     (Roaring *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffec);
  uVar2 = (uint)bVar1;
  std::operator==(in_RDI,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  _assert_true(in_RSI,(char *)CONCAT44(uVar3,uVar2),(char *)in_RDI,in_stack_ffffffffffffffdc);
  return (bool)((byte)((uint)uVar3 >> 0x18) & 1);
}

Assistant:

bool operator==(const Roaring &r) const {
        bool ans = (plain == r.plain);
        assert_true(ans == (check == r.check));
        return ans;
    }